

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LSTMParams::SerializeWithCachedSizes
          (LSTMParams *this,CodedOutputStream *output)

{
  bool bVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LSTMParams *this_local;
  
  bVar1 = sequenceoutput(this);
  if (bVar1) {
    bVar1 = sequenceoutput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  bVar1 = hasbiasvectors(this);
  if (bVar1) {
    bVar1 = hasbiasvectors(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x14,bVar1,output);
  }
  bVar1 = forgetbias(this);
  if (bVar1) {
    bVar1 = forgetbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x1e,bVar1,output);
  }
  bVar1 = haspeepholevectors(this);
  if (bVar1) {
    bVar1 = haspeepholevectors(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x28,bVar1,output);
  }
  bVar1 = coupledinputandforgetgate(this);
  if (bVar1) {
    bVar1 = coupledinputandforgetgate(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,bVar1,output);
  }
  fVar2 = cellclipthreshold(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = cellclipthreshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x3c,fVar2,output);
  }
  return;
}

Assistant:

void LSTMParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LSTMParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool sequenceOutput = 10;
  if (this->sequenceoutput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->sequenceoutput(), output);
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->hasbiasvectors(), output);
  }

  // bool forgetBias = 30;
  if (this->forgetbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(30, this->forgetbias(), output);
  }

  // bool hasPeepholeVectors = 40;
  if (this->haspeepholevectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(40, this->haspeepholevectors(), output);
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->coupledinputandforgetgate() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->coupledinputandforgetgate(), output);
  }

  // float cellClipThreshold = 60;
  if (this->cellclipthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(60, this->cellclipthreshold(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LSTMParams)
}